

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_maari_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  int index;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  uVar1 = (uint)arg1 & 0x3f;
  if (uVar1 == 0x3f) {
    env->CP0_MAARI = 0xf;
  }
  else if (uVar1 < 0x10) {
    env->CP0_MAARI = uVar1;
  }
  return;
}

Assistant:

void helper_mtc0_maari(CPUMIPSState *env, target_ulong arg1)
{
    int index = arg1 & 0x3f;
    if (index == 0x3f) {
        /*
         * Software may write all ones to INDEX to determine the
         *  maximum value supported.
         */
        env->CP0_MAARI = MIPS_MAAR_MAX - 1;
    } else if (index < MIPS_MAAR_MAX) {
        env->CP0_MAARI = index;
    }
    /*
     * Other than the all ones, if the value written is not supported,
     * then INDEX is unchanged from its previous value.
     */
}